

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::SimpleDescriptorDatabaseExtraTest_FindAllMessageNames_Test::
TestBody(SimpleDescriptorDatabaseExtraTest_FindAllMessageNames_Test *this)

{
  bool bVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar2;
  InternalMetadata IVar3;
  Arena *pAVar4;
  char *message;
  pointer *__ptr;
  char *in_R9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2c8;
  AssertHelper local_2c0;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  SimpleDescriptorDatabase db;
  FileDescriptorProto b;
  FileDescriptorProto f;
  
  FileDescriptorProto::FileDescriptorProto(&f);
  f.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       f.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  IVar3 = f.super_Message.super_MessageLite._internal_metadata_;
  if ((f.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    IVar3.ptr_ = *(undefined8 *)
                  (f.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&f.field_0._impl_.name_,"foo.proto",(Arena *)IVar3.ptr_);
  f.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       f.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  if ((f.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    f.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(undefined8 *)
          (f.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set
            (&f.field_0._impl_.package_,"foo",
             (Arena *)f.super_Message.super_MessageLite._internal_metadata_.ptr_);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&f.field_0._impl_.message_type_.super_RepeatedPtrFieldBase);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar4 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.name_,"Foo",pAVar4);
  FileDescriptorProto::FileDescriptorProto(&b);
  b.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       b.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  IVar3 = b.super_Message.super_MessageLite._internal_metadata_;
  if ((b.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    IVar3.ptr_ = *(undefined8 *)
                  (b.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&b.field_0._impl_.name_,"bar.proto",(Arena *)IVar3.ptr_);
  b.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       b.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 2;
  if ((b.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    b.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(undefined8 *)
          (b.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe);
  }
  message = anon_var_dwarf_651463 + 5;
  internal::ArenaStringPtr::Set
            (&b.field_0._impl_.package_,anon_var_dwarf_651463 + 5,
             (Arena *)b.super_Message.super_MessageLite._internal_metadata_.ptr_);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&b.field_0._impl_.message_type_.super_RepeatedPtrFieldBase);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar4 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.name_,"Bar",pAVar4);
  SimpleDescriptorDatabase::SimpleDescriptorDatabase(&db);
  SimpleDescriptorDatabase::Add(&db,&f);
  SimpleDescriptorDatabase::Add(&db,&b);
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = DescriptorDatabase::FindAllMessageNames(&db.super_DescriptorDatabase,&messages);
  gtest_ar_.success_ = bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"db.FindAllMessageNames(&messages)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x21e,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_2c0,(Message *)&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (local_2c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2c8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_8_ = (long)"TestService.Bar" + 0xc;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )((long)
          "Missing extension declaration for field foo.my_field with number 5000 in extendee message foo.Foo"
         + 0x5a);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<char_const*,char_const*>>>
  ::operator()(&gtest_ar,&gtest_ar_.success_,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0xfccc26);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x21f,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2c8,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2c8);
    if (gtest_ar_._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&messages);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase(&db);
  FileDescriptorProto::~FileDescriptorProto(&b);
  FileDescriptorProto::~FileDescriptorProto(&f);
  return;
}

Assistant:

TEST(SimpleDescriptorDatabaseExtraTest, FindAllMessageNames) {
  FileDescriptorProto f;
  f.set_name("foo.proto");
  f.set_package("foo");
  f.add_message_type()->set_name("Foo");

  FileDescriptorProto b;
  b.set_name("bar.proto");
  b.set_package("");
  b.add_message_type()->set_name("Bar");

  SimpleDescriptorDatabase db;
  db.Add(f);
  db.Add(b);

  std::vector<std::string> messages;
  EXPECT_TRUE(db.FindAllMessageNames(&messages));
  EXPECT_THAT(messages, ::testing::UnorderedElementsAre("foo.Foo", "Bar"));
}